

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<true,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase **msg_00;
  uint16_t type_card_00;
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  FieldEntry *pFVar3;
  ParseContext *p;
  bool bVar4;
  unsigned_short uVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  LogMessage *pLVar11;
  FieldAux *pFVar12;
  MessageLite *pMVar13;
  uint *puVar14;
  ulong uVar15;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2d8 [2];
  TcFieldData local_2c8 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2b8;
  TcParseTableBase ***local_2b0;
  anon_class_24_3_0d95dd66 inner_loop;
  MessageLite *value;
  ParseContext *pPStack_288;
  uint32_t next_tag;
  char *ptr2;
  ParseContext *local_278;
  TcParseTableBase *inner_table;
  RepeatedPtrFieldBase *field;
  void *base;
  LogMessage local_258;
  Voidify local_247;
  unsigned_short local_246;
  int local_244;
  Nullable<const_char_*> local_240;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  uint32_t decoded_wiretype;
  uint32_t decoded_tag;
  Voidify local_21f;
  unsigned_short local_21e;
  int local_21c;
  Nullable<const_char_*> local_218;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldEntry *pFStack_208;
  uint16_t type_card;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_1c8;
  TcFieldData local_1c0;
  undefined1 local_1b1;
  FieldEntry *pFStack_1b0;
  bool always_return;
  TcParseTableBase *local_1a8;
  ParseContext *local_1a0;
  ParseContext *local_198;
  MessageLite *local_190;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_188;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_180;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_178;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t has_bits_offset_1;
  LogMessage local_88;
  Voidify local_71;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_3;
  Voidify local_51;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  int old_group_depth;
  int old_depth;
  uint32_t local_34;
  ParseContext *local_30;
  TcParseTableBase *local_28;
  ParseContext *local_20;
  ParseContext *local_18;
  TcParseTableBase ****local_10;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar6 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  pFStack_208 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar6);
  absl_log_internal_check_op_result._6_2_ = pFStack_208->type_card;
  local_21c = absl::lts_20250127::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result._6_2_ & 0x30);
  local_21e = absl::lts_20250127::log_internal::GetReferenceableValue(0x20);
  local_218 = absl::lts_20250127::log_internal::Check_EQImpl<int,unsigned_short>
                        (&local_21c,&local_21e,
                         "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                        );
  if (local_218 != (Nullable<const_char_*>)0x0) {
    pcVar10 = absl::lts_20250127::implicit_cast<char_const*>(local_218);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&decoded_wiretype,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0xa18,pcVar10);
    pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                        ((LogMessage *)&decoded_wiretype);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21f,pLVar11);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&decoded_wiretype);
  }
  absl_log_internal_check_op_result_1._4_4_ = TcFieldData::tag((TcFieldData *)&msg_local);
  absl_log_internal_check_op_result_1._0_4_ = absl_log_internal_check_op_result_1._4_4_ & 7;
  local_244 = absl::lts_20250127::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result._6_2_ & 0x1c0);
  local_246 = absl::lts_20250127::log_internal::GetReferenceableValue(0x40);
  local_240 = absl::lts_20250127::log_internal::Check_EQImpl<int,unsigned_short>
                        (&local_244,&local_246,
                         "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepGroup)"
                        );
  if (local_240 != (Nullable<const_char_*>)0x0) {
    pcVar10 = absl::lts_20250127::implicit_cast<char_const*>(local_240);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0xa25,pcVar10);
    pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_258);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_247,pLVar11);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_258);
  }
  if ((uint)absl_log_internal_check_op_result_1 != 3) {
    base = msg_local;
    pcVar10 = (char *)(**(code **)(hasbits_local + 0x30))
                                (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
    return pcVar10;
  }
  field = (RepeatedPtrFieldBase *)
          MaybeGetSplitBase((MessageLite *)ptr_local,true,(TcParseTableBase *)hasbits_local);
  inner_table = (TcParseTableBase *)
                MaybeCreateRepeatedRefAt<google::protobuf::internal::RepeatedPtrFieldBase,true>
                          (field,(ulong)pFStack_208->offset,(MessageLite *)ptr_local);
  type_card_00 = absl_log_internal_check_op_result._6_2_;
  pFVar12 = TcParseTableBase::field_aux((TcParseTableBase *)hasbits_local,pFStack_208);
  ptr2 = *(char **)pFVar12;
  local_278 = (ParseContext *)GetTableFromAux(type_card_00,(FieldAux)ptr2);
  pPStack_288 = ctx_local;
  while( true ) {
    pMVar13 = AddMessage((TcParseTableBase *)local_278,(RepeatedPtrFieldBase *)inner_table);
    pTVar1 = table_local;
    msg_00 = inner_loop.inner_table;
    local_2b0 = &inner_loop.inner_table;
    inner_loop.value = (MessageLite **)&table_local;
    inner_loop.ctx = &local_278;
    local_28 = table_local;
    local_30 = pPStack_288;
    local_34 = absl_log_internal_check_op_result_1._4_4_;
    _old_group_depth = &local_2b0;
    iVar7 = *(int *)&table_local[1].class_data + -1;
    *(int *)&table_local[1].class_data = iVar7;
    inner_loop.inner_table = (TcParseTableBase **)pMVar13;
    if (iVar7 < 0) {
      local_20 = (ParseContext *)0x0;
    }
    else {
      *(int *)((long)&table_local[1].class_data + 4) =
           *(int *)((long)&table_local[1].class_data + 4) + 1;
      absl_log_internal_check_op_result_2._4_4_ = *(int *)&table_local[1].class_data;
      absl_log_internal_check_op_result_2._0_4_ = *(int *)((long)&table_local[1].class_data + 4);
      local_18 = pPStack_288;
      local_10 = _old_group_depth;
      local_30 = (ParseContext *)
                 ParseLoopPreserveNone
                           ((MessageLite *)msg_00,(char *)pPStack_288,(ParseContext *)table_local,
                            (TcParseTableBase *)local_278);
      if (local_30 != (ParseContext *)0x0) {
        iVar7 = absl::lts_20250127::log_internal::GetReferenceableValue
                          (absl_log_internal_check_op_result_2._4_4_);
        iVar8 = absl::lts_20250127::log_internal::GetReferenceableValue
                          (*(int *)&pTVar1[1].class_data);
        local_50 = absl::lts_20250127::log_internal::Check_EQImpl(iVar7,iVar8,"old_depth == depth_")
        ;
        if (local_50 != (Nullable<const_char_*>)0x0) {
          pcVar10 = absl::lts_20250127::implicit_cast<char_const*>(local_50);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&absl_log_internal_check_op_result_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,0x491,pcVar10);
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                              ((LogMessage *)&absl_log_internal_check_op_result_3);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar11);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&absl_log_internal_check_op_result_3);
        }
        iVar7 = absl::lts_20250127::log_internal::GetReferenceableValue
                          ((int)absl_log_internal_check_op_result_2);
        iVar8 = absl::lts_20250127::log_internal::GetReferenceableValue
                          (*(int *)((long)&pTVar1[1].class_data + 4));
        local_70 = absl::lts_20250127::log_internal::Check_EQImpl
                             (iVar7,iVar8,"old_group_depth == group_depth_");
        if (local_70 != (Nullable<const_char_*>)0x0) {
          pcVar10 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,0x492,pcVar10);
          pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar11);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_88);
        }
        local_70 = (Nullable<const_char_*>)0x0;
      }
      *(int *)((long)&pTVar1[1].class_data + 4) = *(int *)((long)&pTVar1[1].class_data + 4) + -1;
      *(int *)&pTVar1[1].class_data = *(int *)&pTVar1[1].class_data + 1;
      bVar4 = EpsCopyInputStream::ConsumeEndGroup((EpsCopyInputStream *)pTVar1,local_34);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        local_20 = local_30;
      }
      else {
        local_20 = (ParseContext *)0x0;
      }
    }
    ctx_local = local_20;
    if (local_20 == (ParseContext *)0x0) break;
    bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)table_local,(char *)local_20);
    pcVar10 = ptr_local;
    pPVar2 = ctx_local;
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(local_2c8);
      if (*(ushort *)hasbits_local != 0) {
        uVar9 = (uint)entry;
        puVar14 = RefAt<unsigned_int>(pcVar10,(ulong)(uint)*(ushort *)hasbits_local);
        *puVar14 = uVar9 | *puVar14;
      }
      return (char *)pPVar2;
    }
    pPStack_288 = (ParseContext *)ReadTag((char *)ctx_local,(uint32_t *)((long)&value + 4),0);
    pcVar10 = ptr_local;
    pPVar2 = ctx_local;
    pTVar1 = table_local;
    if (pPStack_288 == (ParseContext *)0x0) break;
    if (value._4_4_ != absl_log_internal_check_op_result_1._4_4_) {
      TcFieldData::TcFieldData((TcFieldData *)&local_2b8);
      local_188 = local_2b8;
      local_190 = (MessageLite *)pcVar10;
      local_198 = pPVar2;
      local_1a0 = (ParseContext *)pTVar1;
      local_1a8 = (TcParseTableBase *)hasbits_local;
      pFStack_1b0 = entry;
      local_1b1 = 0;
      bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar1,(char *)pPVar2);
      pMVar13 = local_190;
      p = local_198;
      pPVar2 = local_1a0;
      if (!bVar4) {
        TcFieldData::TcFieldData(&local_1c0);
        if (local_1a8->has_bits_offset != 0) {
          uVar9 = (uint)pFStack_1b0;
          puVar14 = RefAt<unsigned_int>(pMVar13,(ulong)(uint)local_1a8->has_bits_offset);
          *puVar14 = uVar9 | *puVar14;
        }
        return (char *)p;
      }
      TcFieldData::TcFieldData(&local_1c8);
      pTVar1 = local_1a8;
      pFVar3 = pFStack_1b0;
      uVar5 = UnalignedLoad<unsigned_short>((char *)p);
      uVar15 = (ulong)(int)((uint)uVar5 & (uint)pTVar1->fast_idx_mask);
      if ((uVar15 & 7) == 0) {
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(pTVar1,uVar15 >> 3);
        local_178.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
             (ulong)uVar5;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_180.data = local_178.data;
        pcVar10 = (*UNRECOVERED_JUMPTABLE)
                            (pMVar13,(char *)p,pPVar2,(TcFieldData)local_178,pTVar1,(uint64_t)pFVar3
                            );
        return pcVar10;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  }
  pcVar10 = ptr_local;
  pPVar2 = ctx_local;
  pTVar1 = table_local;
  TcFieldData::TcFieldData((TcFieldData *)local_2d8);
  pcVar10 = Error((MessageLite *)pcVar10,(char *)pPVar2,(ParseContext *)pTVar1,
                  (TcFieldData)local_2d8[0],(TcParseTableBase *)hasbits_local,(uint64_t)entry);
  return pcVar10;
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}